

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDefs.cpp
# Opt level: O2

void de::throwRuntimeError(char *message,char *expr,char *file,int line)

{
  ostream *poVar1;
  runtime_error *this;
  char *pcVar2;
  string asStack_1c8 [32];
  ostringstream msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  pcVar2 = "Runtime check failed";
  if (message != (char *)0x0) {
    pcVar2 = message;
  }
  poVar1 = std::operator<<((ostream *)&msg,pcVar2);
  std::operator<<(poVar1,": ");
  if (expr != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&msg,'\'');
    poVar1 = std::operator<<(poVar1,expr);
    std::operator<<(poVar1,'\'');
  }
  poVar1 = std::operator<<((ostream *)&msg," at ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<((ostream *)poVar1,line);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_1c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwRuntimeError (const char* message, const char* expr, const char* file, int line)
{
	std::ostringstream msg;
	msg << (message ? message : "Runtime check failed") << ": ";
	if (expr)
		msg << '\'' << expr << '\'';
	msg << " at " << file << ":" << line;
	throw std::runtime_error(msg.str());
}